

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

void mipsdsp_rndrashift_short_acc(int64_t *p,int32_t ac,int32_t shift,CPUMIPSState_conflict5 *env)

{
  ulong uVar1;
  long local_30;
  int64_t acc;
  CPUMIPSState_conflict5 *env_local;
  int32_t shift_local;
  int32_t ac_local;
  int64_t *p_local;
  
  uVar1 = (env->active_tc).HI[ac] << 0x20 | (env->active_tc).LO[ac] & 0xffffffff;
  if (shift == 0) {
    local_30 = uVar1 << 1;
  }
  else {
    local_30 = (long)uVar1 >> ((char)shift - 1U & 0x3f);
  }
  *p = local_30;
  p[1] = (long)uVar1 >> 0x3f & 1;
  return;
}

Assistant:

static inline void mipsdsp_rndrashift_short_acc(int64_t *p,
                                                int32_t ac,
                                                int32_t shift,
                                                CPUMIPSState *env)
{
    int64_t acc;

    acc = ((int64_t)env->active_tc.HI[ac] << 32) |
          ((int64_t)env->active_tc.LO[ac] & 0xFFFFFFFF);
    p[0] = (shift == 0) ? (acc << 1) : (acc >> (shift - 1));
    p[1] = (acc >> 63) & 0x01;
}